

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DequoteToken(Token *p)

{
  uint uVar1;
  byte *pbVar2;
  long lVar3;
  
  uVar1 = p->n;
  if ((1 < uVar1) && (pbVar2 = (byte *)p->z, (char)""[*pbVar2] < '\0')) {
    if (1 < uVar1 - 1) {
      lVar3 = 0;
      do {
        if ((char)""[pbVar2[lVar3 + 1]] < '\0') {
          return;
        }
        lVar3 = lVar3 + 1;
      } while (uVar1 - 2 != (int)lVar3);
    }
    p->n = uVar1 - 2;
    p->z = (char *)(pbVar2 + 1);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DequoteToken(Token *p){
  unsigned int i;
  if( p->n<2 ) return;
  if( !sqlite3Isquote(p->z[0]) ) return;
  for(i=1; i<p->n-1; i++){
    if( sqlite3Isquote(p->z[i]) ) return;
  }
  p->n -= 2;
  p->z++;
}